

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O3

BrandedDecl * __thiscall
capnp::compiler::BrandScope::interpretResolve
          (BrandedDecl *__return_storage_ptr__,BrandScope *this,Resolver *resolver,
          ResolveResult *result,Reader source)

{
  anon_union_96_1_a8a2e026_for_OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_2
  *paVar1;
  undefined8 *puVar2;
  byte bVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  Reader brand;
  Resolver *resolver_00;
  long *typeId;
  int iVar14;
  Disposer *pDVar15;
  bool bVar16;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> OVar17;
  BrandScope *local_270;
  undefined1 local_268 [16];
  Maybe<capnp::compiler::BrandedDecl> local_258;
  undefined1 local_178 [16];
  BrandScope *local_168;
  Disposer *pDStack_160;
  BrandScope *local_158;
  BrandedDecl *pBStack_150;
  size_t local_148;
  char local_140;
  size_t local_138;
  ArrayDisposer *pAStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  Disposer *local_108;
  BrandScope *local_100;
  SegmentReader *local_f8;
  CapTableReader *pCStack_f0;
  void *local_e8;
  WirePointer *pWStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  byte local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ListReader local_60;
  
  if (result->tag == 1) {
    paVar1 = &result->field_1;
    pop((BrandScope *)&local_258,(uint64_t)this);
    local_a0 = (result->field_1).space[0x28];
    puVar2 = (undefined8 *)((long)&result->field_1 + 0x30);
    if (local_a0 == '\x01') {
      resolver_00 = (Resolver *)
                    CONCAT44(local_258.ptr.field_1._4_4_,local_258.ptr.field_1.value.body.tag);
      local_c8 = *(undefined8 *)paVar1;
      uStack_c0 = *(undefined8 *)((long)&result->field_1 + 8);
      local_b8 = *(undefined8 *)((long)&result->field_1 + 0x10);
      uStack_b0 = *(undefined8 *)((long)&result->field_1 + 0x18);
      local_a8 = *(undefined8 *)((long)&result->field_1 + 0x20);
      local_98 = *puVar2;
      uStack_90 = *(undefined8 *)((long)&result->field_1 + 0x38);
      local_88 = *(undefined8 *)((long)&result->field_1 + 0x40);
      uStack_80 = *(undefined8 *)((long)&result->field_1 + 0x48);
      local_78 = *(undefined8 *)((long)&result->field_1 + 0x50);
      uStack_70 = *(undefined8 *)((long)&result->field_1 + 0x58);
      bVar16 = *(short *)((long)&result->field_1 + 0x54) == 0;
      local_168 = (BrandScope *)*(WirePointer **)((long)&result->field_1 + 0x48);
      if (bVar16) {
        local_168 = (BrandScope *)(WirePointer *)0x0;
      }
      iVar14 = 0x7fffffff;
      if (!bVar16) {
        iVar14 = *(int *)((long)&result->field_1 + 0x58);
      }
      local_178._0_4_ = 0;
      local_178._4_4_ = 0;
      local_178._8_4_ = 0;
      local_178._12_4_ = 0;
      if (!bVar16) {
        local_178._0_4_ = *(undefined4 *)((long)&result->field_1 + 0x30);
        local_178._4_4_ = *(undefined4 *)((long)&result->field_1 + 0x34);
        local_178._8_4_ = *(uint *)((long)&result->field_1 + 0x38);
        local_178._12_4_ = *(undefined4 *)((long)&result->field_1 + 0x3c);
      }
      pDStack_160 = (Disposer *)CONCAT44(pDStack_160._4_4_,iVar14);
      capnp::_::PointerReader::getList
                (&local_60,(PointerReader *)local_178,INLINE_COMPOSITE,(word *)0x0);
      brand.reader.capTable = local_60.capTable;
      brand.reader.segment = local_60.segment;
      brand.reader.ptr = local_60.ptr;
      brand.reader.elementCount = local_60.elementCount;
      brand.reader.step = local_60.step;
      brand.reader.structDataSize = local_60.structDataSize;
      brand.reader.structPointerCount = local_60.structPointerCount;
      brand.reader.elementSize = local_60.elementSize;
      brand.reader._39_1_ = local_60._39_1_;
      brand.reader.nestingLimit = local_60.nestingLimit;
      brand.reader._44_4_ = local_60._44_4_;
      OVar17 = evaluateBrand((BrandScope *)local_268,resolver_00,(ResolvedDecl *)resolver,brand,
                             (uint)&local_c8);
      uVar5 = local_258.ptr._0_8_;
      local_270 = (BrandScope *)local_268._8_8_;
      local_258.ptr._0_8_ = local_268._0_8_;
      (**(code **)*(_func_int **)uVar5)
                (uVar5,resolver_00->_vptr_Resolver[-2] + (long)&resolver_00->_vptr_Resolver,
                 OVar17.ptr);
      pDVar15 = (Disposer *)local_268._0_8_;
    }
    else {
      typeId = (long *)CONCAT44(local_258.ptr.field_1._4_4_,local_258.ptr.field_1.value.body.tag);
      OVar17 = push((BrandScope *)local_178,(uint64_t)typeId,(uint)*(undefined8 *)&result->field_1);
      pDVar15 = (Disposer *)CONCAT44(local_178._4_4_,local_178._0_4_);
      local_270 = (BrandScope *)CONCAT44(local_178._12_4_,local_178._8_4_);
      (**(code **)*(_func_int **)local_258.ptr._0_8_)
                (local_258.ptr._0_8_,(long)typeId + *(long *)(*typeId + -0x10),OVar17.ptr);
    }
    bVar3 = (result->field_1).space[0x28];
    if (bVar3 == '\x01') {
      uVar5 = *puVar2;
      uVar6 = *(undefined8 *)((long)&result->field_1 + 0x38);
      uVar7 = *(undefined8 *)((long)&result->field_1 + 0x40);
      uVar8 = *(undefined8 *)((long)&result->field_1 + 0x48);
      uVar9 = *(undefined8 *)((long)&result->field_1 + 0x50);
      uVar10 = *(undefined8 *)((long)&result->field_1 + 0x58);
      (__return_storage_ptr__->source)._reader.dataSize = source._reader.dataSize;
      (__return_storage_ptr__->source)._reader.pointerCount = source._reader.pointerCount;
      *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = source._reader._38_2_;
      (__return_storage_ptr__->source)._reader.nestingLimit = source._reader.nestingLimit;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.field_0x2c = source._reader._44_4_;
      (__return_storage_ptr__->source)._reader.data = source._reader.data;
      (__return_storage_ptr__->source)._reader.pointers = source._reader.pointers;
      (__return_storage_ptr__->source)._reader.segment = source._reader.segment;
      (__return_storage_ptr__->source)._reader.capTable = source._reader.capTable;
      (__return_storage_ptr__->brand).disposer = pDVar15;
      (__return_storage_ptr__->brand).ptr = local_270;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x20) =
           *(undefined8 *)((long)&result->field_1 + 0x20);
      uVar11 = *(undefined8 *)paVar1;
      uVar12 = *(undefined8 *)((long)&result->field_1 + 8);
      uVar13 = *(undefined8 *)((long)&result->field_1 + 0x18);
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x10) =
           *(undefined8 *)((long)&result->field_1 + 0x10);
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x18) = uVar13;
      *(undefined8 *)&(__return_storage_ptr__->body).field_1 = uVar11;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = uVar12;
      (__return_storage_ptr__->body).field_1.space[0x28] = '\x01';
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x50) = uVar9;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x58) = uVar10;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x40) = uVar7;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x48) = uVar8;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x30) = uVar5;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x38) = uVar6;
    }
    else {
      (__return_storage_ptr__->source)._reader.dataSize = source._reader.dataSize;
      (__return_storage_ptr__->source)._reader.pointerCount = source._reader.pointerCount;
      *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = source._reader._38_2_;
      (__return_storage_ptr__->source)._reader.nestingLimit = source._reader.nestingLimit;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.field_0x2c = source._reader._44_4_;
      (__return_storage_ptr__->source)._reader.data = source._reader.data;
      (__return_storage_ptr__->source)._reader.pointers = source._reader.pointers;
      (__return_storage_ptr__->source)._reader.segment = source._reader.segment;
      (__return_storage_ptr__->source)._reader.capTable = source._reader.capTable;
      (__return_storage_ptr__->brand).disposer = pDVar15;
      (__return_storage_ptr__->brand).ptr = local_270;
      uVar5 = *(undefined8 *)((long)&result->field_1 + 8);
      uVar6 = *(undefined8 *)((long)&result->field_1 + 0x10);
      uVar7 = *(undefined8 *)((long)&result->field_1 + 0x18);
      *(undefined8 *)&(__return_storage_ptr__->body).field_1 = *(undefined8 *)paVar1;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = uVar5;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x10) = uVar6;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x18) = uVar7;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x20) =
           *(undefined8 *)((long)&result->field_1 + 0x20);
      (__return_storage_ptr__->body).field_1.space[0x28] = bVar3;
    }
    (__return_storage_ptr__->body).tag = 1;
  }
  else {
    lookupParameter(&local_258,this,resolver,*(uint64_t *)&result->field_1,
                    *(uint *)((long)&result->field_1 + 8));
    local_178[0] = local_258.ptr.isSet;
    if (local_258.ptr.isSet == true) {
      local_178._8_4_ = local_258.ptr.field_1.value.body.tag;
      if (local_258.ptr.field_1.value.body.tag == 2) {
        local_168 = (BrandScope *)local_258.ptr.field_1._8_8_;
        pDStack_160 = (Disposer *)local_258.ptr.field_1._16_8_;
      }
      else if (local_258.ptr.field_1.value.body.tag == 1) {
        local_148 = local_258.ptr.field_1._40_8_;
        local_158 = (BrandScope *)local_258.ptr.field_1._24_8_;
        pBStack_150 = (BrandedDecl *)local_258.ptr.field_1._32_8_;
        local_168 = (BrandScope *)local_258.ptr.field_1._8_8_;
        pDStack_160 = (Disposer *)local_258.ptr.field_1._16_8_;
        local_140 = local_258.ptr.field_1._48_1_;
        if (local_258.ptr.field_1._48_1_ == '\x01') {
          local_118 = local_258.ptr.field_1._88_8_;
          uStack_110 = local_258.ptr.field_1._96_8_;
          local_128 = local_258.ptr.field_1._72_8_;
          uStack_120 = local_258.ptr.field_1._80_8_;
          local_138 = local_258.ptr.field_1._56_8_;
          pAStack_130 = (ArrayDisposer *)local_258.ptr.field_1._64_8_;
        }
      }
      local_108 = local_258.ptr.field_1.value.brand.disposer;
      local_100 = local_258.ptr.field_1.value.brand.ptr;
      local_f8 = local_258.ptr.field_1.value.source._reader.segment;
      pCStack_f0 = local_258.ptr.field_1.value.source._reader.capTable;
      local_e8 = local_258.ptr.field_1.value.source._reader.data;
      pWStack_e0 = local_258.ptr.field_1.value.source._reader.pointers;
      local_d8 = local_258.ptr.field_1._152_8_;
      uStack_d0 = local_258.ptr.field_1._160_8_;
      BrandedDecl::BrandedDecl(__return_storage_ptr__,(BrandedDecl *)(local_178 + 8));
      if (local_258.ptr.field_1.value.brand.ptr != (BrandScope *)0x0) {
        (**(local_258.ptr.field_1.value.brand.disposer)->_vptr_Disposer)
                  (local_258.ptr.field_1.value.brand.disposer,
                   ((local_258.ptr.field_1.value.brand.ptr)->super_Refcounted).super_Disposer.
                   _vptr_Disposer[-2] +
                   (long)&((local_258.ptr.field_1.value.brand.ptr)->super_Refcounted).super_Disposer
                          ._vptr_Disposer);
      }
    }
    else {
      uVar5 = *(undefined8 *)&result->field_1;
      uVar4 = *(undefined4 *)((long)&result->field_1 + 8);
      (__return_storage_ptr__->source)._reader.dataSize = source._reader.dataSize;
      (__return_storage_ptr__->source)._reader.pointerCount = source._reader.pointerCount;
      *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = source._reader._38_2_;
      (__return_storage_ptr__->source)._reader.nestingLimit = source._reader.nestingLimit;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.field_0x2c = source._reader._44_4_;
      (__return_storage_ptr__->source)._reader.data = source._reader.data;
      (__return_storage_ptr__->source)._reader.pointers = source._reader.pointers;
      (__return_storage_ptr__->source)._reader.segment = source._reader.segment;
      (__return_storage_ptr__->source)._reader.capTable = source._reader.capTable;
      (__return_storage_ptr__->brand).disposer = (Disposer *)0x0;
      (__return_storage_ptr__->brand).ptr = (BrandScope *)0x0;
      *(undefined8 *)&(__return_storage_ptr__->body).field_1 = uVar5;
      *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = uVar4;
      (__return_storage_ptr__->body).tag = 2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BrandedDecl BrandScope::interpretResolve(
    Resolver& resolver, Resolver::ResolveResult& result, Expression::Reader source) {
  if (result.is<Resolver::ResolvedDecl>()) {
    auto& decl = result.get<Resolver::ResolvedDecl>();

    auto scope = pop(decl.scopeId);
    KJ_IF_SOME(brand, decl.brand) {
      scope = scope->evaluateBrand(resolver, decl, brand.getScopes());
    } else {
      scope = scope->push(decl.id, decl.genericParamCount);
    }

    return BrandedDecl(decl, kj::mv(scope), source);
  }